

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

BitcastType __thiscall
spirv_cross::CompilerHLSL::get_bitcast_type(CompilerHLSL *this,uint32_t result_type,uint32_t op0)

{
  SPIRType *pSVar1;
  SPIRType *pSVar2;
  SPIRType *expr_type;
  SPIRType *rslt_type;
  uint32_t op0_local;
  uint32_t result_type_local;
  CompilerHLSL *this_local;
  
  pSVar1 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
  pSVar2 = Compiler::expression_type((Compiler *)this,op0);
  if (((pSVar1->basetype == UInt64) && (pSVar2->basetype == UInt)) && (pSVar2->vecsize == 2)) {
    this_local._4_4_ = TypePackUint2x32;
  }
  else if (((pSVar1->basetype == UInt) && (pSVar1->vecsize == 2)) && (pSVar2->basetype == UInt64)) {
    this_local._4_4_ = TypeUnpackUint64;
  }
  else {
    this_local._4_4_ = TypeNormal;
  }
  return this_local._4_4_;
}

Assistant:

CompilerHLSL::BitcastType CompilerHLSL::get_bitcast_type(uint32_t result_type, uint32_t op0)
{
	auto &rslt_type = get<SPIRType>(result_type);
	auto &expr_type = expression_type(op0);

	if (rslt_type.basetype == SPIRType::BaseType::UInt64 && expr_type.basetype == SPIRType::BaseType::UInt &&
	    expr_type.vecsize == 2)
		return BitcastType::TypePackUint2x32;
	else if (rslt_type.basetype == SPIRType::BaseType::UInt && rslt_type.vecsize == 2 &&
	         expr_type.basetype == SPIRType::BaseType::UInt64)
		return BitcastType::TypeUnpackUint64;

	return BitcastType::TypeNormal;
}